

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,PreOrPostIncOrDec *p)

{
  bool bVar1;
  uint uVar2;
  Expression *pEVar3;
  char **args;
  char **args_00;
  char *local_c8;
  CompileMessage local_c0;
  undefined1 local_88 [8];
  Type type;
  char *local_60;
  CompileMessage local_58;
  anon_class_1_0_00000001 local_19;
  PreOrPostIncOrDec *pPStack_18;
  anon_class_1_0_00000001 getOperatorName;
  PreOrPostIncOrDec *p_local;
  PostResolutionChecks *this_local;
  
  pPStack_18 = p;
  ASTVisitor::visit(&this->super_ASTVisitor,p);
  pEVar3 = pool_ref<soul::AST::Expression>::operator->(&pPStack_18->target);
  uVar2 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xf])();
  if ((uVar2 & 1) == 0) {
    pEVar3 = &pPStack_18->super_Expression;
    local_60 = visit::anon_class_1_0_00000001::operator()(&local_19,pPStack_18);
    Errors::operatorNeedsAssignableTarget<char_const*>(&local_58,(Errors *)&local_60,args);
    AST::Context::throwError(&(pEVar3->super_Statement).super_ASTObject.context,&local_58,false);
  }
  pEVar3 = pool_ref<soul::AST::Expression>::operator->(&pPStack_18->target);
  (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[4])(local_88);
  bVar1 = Type::isBool((Type *)local_88);
  if ((!bVar1) &&
     ((bVar1 = Type::isPrimitive((Type *)local_88), bVar1 ||
      (bVar1 = Type::isBoundedInt((Type *)local_88), bVar1)))) {
    Type::~Type((Type *)local_88);
    return;
  }
  pEVar3 = &pPStack_18->super_Expression;
  local_c8 = visit::anon_class_1_0_00000001::operator()(&local_19,pPStack_18);
  Errors::illegalTypeForOperator<char_const*>(&local_c0,(Errors *)&local_c8,args_00);
  AST::Context::throwError(&(pEVar3->super_Statement).super_ASTObject.context,&local_c0,false);
}

Assistant:

void visit (AST::PreOrPostIncOrDec& p) override
        {
            super::visit (p);

            auto getOperatorName = [] (const AST::PreOrPostIncOrDec& pp)  { return pp.isIncrement ? "++" : "--"; };

            if (! p.target->isAssignable())
                p.context.throwError (Errors::operatorNeedsAssignableTarget (getOperatorName (p)));

            auto type = p.target->getResultType();

            if (type.isBool() || ! (type.isPrimitive() || type.isBoundedInt()))
                p.context.throwError (Errors::illegalTypeForOperator (getOperatorName (p)));
        }